

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__hdr_test(stbi__context *s)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  int iVar3;
  stbi_uc *psVar4;
  stbi_uc *psVar5;
  byte bVar6;
  char cVar7;
  long lVar8;
  
  psVar1 = s->buffer_start;
  psVar2 = s->buffer_start + 1;
  psVar5 = s->img_buffer;
  psVar4 = s->img_buffer_end;
  cVar7 = '#';
  lVar8 = 1;
  while( true ) {
    if (psVar5 < psVar4) {
      s->img_buffer = psVar5 + 1;
      bVar6 = *psVar5;
      psVar5 = psVar5 + 1;
    }
    else if (s->read_from_callbacks == 0) {
      bVar6 = 0;
    }
    else {
      iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
      if (iVar3 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        bVar6 = 0;
        psVar4 = psVar2;
      }
      else {
        bVar6 = *psVar1;
        psVar4 = psVar1 + iVar3;
      }
      s->img_buffer_end = psVar4;
      s->img_buffer = psVar2;
      psVar5 = psVar2;
    }
    if ((uint)bVar6 != (int)cVar7) break;
    cVar7 = "#?RADIANCE\n"[lVar8];
    lVar8 = lVar8 + 1;
    if (lVar8 == 0xc) {
      iVar3 = 1;
LAB_00108c66:
      s->img_buffer = s->img_buffer_original;
      return iVar3;
    }
  }
  iVar3 = 0;
  goto LAB_00108c66;
}

Assistant:

static int stbi__hdr_test(stbi__context* s)
{
   int r = stbi__hdr_test_core(s);
   stbi__rewind(s);
   return r;
}